

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_object_class_test.cpp
# Opt level: O0

object hello_world_class_impl_interface_constructor
                 (klass cls,class_impl impl,char *name,constructor ctor,void **args,size_t size)

{
  undefined1 uVar1;
  undefined1 *__s;
  object poVar2;
  undefined8 uVar3;
  undefined8 in_RDX;
  undefined8 in_RDI;
  undefined8 *in_R8;
  long in_R9;
  object obj;
  hello_world_object hello_world_obj;
  
  __s = (undefined1 *)operator_new(0x10);
  memset(__s,0,0x10);
  poVar2 = (object)object_create(in_RDX,0,__s,hello_world_object_impl_interface_singleton,in_RDI);
  object_increment_reference(poVar2);
  if (in_R8 == (undefined8 *)0x0) {
    *__s = 0x41;
    *(undefined8 *)(__s + 8) = 0;
  }
  else if (in_R9 == 2) {
    uVar1 = value_to_char(*in_R8);
    *__s = uVar1;
    uVar3 = value_to_long(in_R8[1]);
    *(undefined8 *)(__s + 8) = uVar3;
  }
  return poVar2;
}

Assistant:

object hello_world_class_impl_interface_constructor(klass cls, class_impl impl, const char *name, constructor ctor, class_args args, size_t size)
{
	hello_world_object hello_world_obj = new hello_world_object_type();

	(void)impl;
	(void)ctor;

	object obj = object_create(name, ACCESSOR_TYPE_STATIC, hello_world_obj, &hello_world_object_impl_interface_singleton, cls);

	if (object_increment_reference(obj) != 0)
	{
		/* TODO: Abort? */
	}

	if (args == 0)
	{
		// Default constructor
		hello_world_obj->d = 'A';
		hello_world_obj->e = 0L;
	}
	else if (size == 2)
	{
		hello_world_obj->d = value_to_char(args[0]);
		hello_world_obj->e = value_to_long(args[1]);
	}

	return obj;
}